

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json_unix.cpp
# Opt level: O3

bool xmrig::Json::save(char *fileName,Document *doc)

{
  char cVar1;
  OStreamWrapper osw;
  ofstream ofs;
  BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_> local_268;
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  local_260;
  long local_218;
  filebuf local_210 [240];
  ios_base local_120 [264];
  
  std::ofstream::ofstream
            ((basic_ostream<char,_std::char_traits<char>_> *)&local_218,fileName,
             _S_trunc|_S_out|_S_bin);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    local_260.
    super_Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    .level_stack_.allocator_ = (CrtAllocator *)0x0;
    local_260.
    super_Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    .level_stack_.ownAllocator_ = (CrtAllocator *)0x0;
    local_260.
    super_Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    .level_stack_.stack_ = (char *)0x0;
    local_260.
    super_Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    .level_stack_.stackTop_ = (char *)0x0;
    local_260.
    super_Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    .level_stack_.stackEnd_ = (char *)0x0;
    local_260.
    super_Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    .level_stack_.initialCapacity_ = 0x200;
    local_260.
    super_Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    .maxDecimalPlaces_ = 0x144;
    local_260.
    super_Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    .hasRoot_ = false;
    local_260.
    super_Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ._61_1_ = 0x20;
    local_260.indentCharCount_ = 4;
    local_260.formatOptions_ = kFormatSingleLineArray;
    local_268.stream_ = (basic_ostream<char,_std::char_traits<char>_> *)&local_218;
    local_260.
    super_Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    .os_ = &local_268;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
    Accept<rapidjson::PrettyWriter<rapidjson::BasicOStreamWrapper<std::ostream>,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator,0u>>
              ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                *)doc,&local_260);
    free(local_260.
         super_Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
         .level_stack_.stack_);
    operator_delete(local_260.
                    super_Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                    .level_stack_.ownAllocator_);
  }
  local_218 = _VTT;
  *(undefined8 *)(local_210 + *(long *)(_VTT + -0x18) + -8) = _operator_delete__;
  std::filebuf::~filebuf(local_210);
  std::ios_base::~ios_base(local_120);
  return (bool)cVar1;
}

Assistant:

bool xmrig::Json::save(const char *fileName, const rapidjson::Document &doc)
{
    std::ofstream ofs(fileName, std::ios_base::out | std::ios_base::binary | std::ios_base::trunc);
    if (!ofs.is_open()) {
        return false;
    }

    rapidjson::OStreamWrapper osw(ofs);
    rapidjson::PrettyWriter<rapidjson::OStreamWrapper> writer(osw);
    writer.SetFormatOptions(rapidjson::kFormatSingleLineArray);

    doc.Accept(writer);

    return true;
}